

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

char * icu_63::getCharCatName(UChar32 cp)

{
  byte bVar1;
  uint8_t cat;
  char *pcStack_10;
  UChar32 cp_local;
  
  bVar1 = getCharCat(cp);
  if (bVar1 < 0x21) {
    pcStack_10 = *(char **)(charCatNames + (ulong)bVar1 * 8);
  }
  else {
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

static const char *getCharCatName(UChar32 cp) {
    uint8_t cat = getCharCat(cp);

    /* Return unknown if the table of names above is not up to
       date. */

    if (cat >= UPRV_LENGTHOF(charCatNames)) {
        return "unknown";
    } else {
        return charCatNames[cat];
    }
}